

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O1

void Cec_ManSavePattern(Cec_ManSat_t *p,Gia_Obj_t *pObj1,Gia_Obj_t *pObj2)

{
  p->vCex->nSize = 0;
  Gia_ManIncrementTravId(p->pAig);
  Cec_ManSatSolveMiter_rec(p,p->pAig,(Gia_Obj_t *)((ulong)pObj1 & 0xfffffffffffffffe));
  if (pObj2 != (Gia_Obj_t *)0x0) {
    Cec_ManSatSolveMiter_rec(p,p->pAig,(Gia_Obj_t *)((ulong)pObj2 & 0xfffffffffffffffe));
    return;
  }
  return;
}

Assistant:

void Cec_ManSavePattern( Cec_ManSat_t * p, Gia_Obj_t * pObj1, Gia_Obj_t * pObj2 )
{
    Vec_IntClear( p->vCex );
    Gia_ManIncrementTravId( p->pAig );
    Cec_ManSatSolveMiter_rec( p, p->pAig, Gia_Regular(pObj1) );
    if ( pObj2 )
    Cec_ManSatSolveMiter_rec( p, p->pAig, Gia_Regular(pObj2) );
}